

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O3

void ncnn::resize_bilinear_font(uchar *font_bitmap,uchar *resized_font_bitmap,int fontpixelsize)

{
  long lVar1;
  ushort uVar2;
  int iVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  uint uVar36;
  int *piVar37;
  long lVar38;
  int iVar39;
  int iVar40;
  void *pvVar41;
  ulong uVar42;
  byte *pbVar43;
  undefined1 (*pauVar44) [16];
  undefined1 (*pauVar45) [16];
  int dx;
  long lVar46;
  undefined1 (*pauVar47) [16];
  undefined1 (*pauVar48) [16];
  byte bVar49;
  uchar *puVar50;
  byte *pbVar51;
  ulong uVar52;
  undefined1 (*pauVar53) [16];
  long lVar54;
  byte bVar55;
  int iVar56;
  uchar *puVar57;
  undefined1 (*pauVar58) [16];
  uint uVar59;
  byte bVar60;
  uint uVar61;
  uint uVar62;
  ulong uVar63;
  uint uVar64;
  float fVar65;
  float fVar66;
  double dVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined8 local_138;
  ushort *local_128;
  Mat local_c8;
  Mat local_78;
  
  uVar36 = fontpixelsize * 2;
  uVar42 = 0xffffffffffffffff;
  if (-1 < fontpixelsize) {
    uVar42 = (long)(fontpixelsize * 6) << 2;
  }
  pvVar41 = operator_new__(uVar42);
  lVar46 = (long)fontpixelsize;
  lVar1 = (long)(int)uVar36 * 4 + lVar46 * 4;
  local_128 = (ushort *)((long)pvVar41 + lVar46 * 4 + lVar1);
  uVar42 = (ulong)(uint)fontpixelsize;
  if (0 < fontpixelsize) {
    uVar52 = 0;
    do {
      dVar67 = ((double)(int)uVar52 + 0.5) * (20.0 / (double)fontpixelsize) + -0.5;
      fVar65 = (float)dVar67;
      fVar66 = floorf(fVar65);
      local_138._4_4_ = (float)((ulong)dVar67 >> 0x20);
      *(int *)((long)pvVar41 + uVar52 * 4) = (int)fVar66;
      fVar65 = (fVar65 - (float)(int)fVar66) * 2048.0;
      uVar64 = -(uint)(0.0 <= 2048.0 - fVar65);
      auVar68._0_4_ = (int)((float)(uVar64 & 0x3f000000 | ~uVar64 & 0xbf000000) + (2048.0 - fVar65))
      ;
      auVar68._4_4_ =
           (int)((float)(-(uint)(0.0 <= fVar65) & 0x3f000000 | ~-(uint)(0.0 <= fVar65) & 0xbf000000)
                + fVar65);
      auVar68._8_4_ = 0;
      auVar68._12_4_ = (int)(local_138._4_4_ + 0.0);
      auVar68 = packssdw(auVar68,auVar68);
      *(int *)((long)pvVar41 + uVar52 * 4 + lVar1) = auVar68._0_4_;
      uVar52 = uVar52 + 1;
    } while (uVar42 != uVar52);
    if (0 < fontpixelsize) {
      uVar52 = 1;
      if (1 < (int)uVar36) {
        uVar52 = (ulong)uVar36;
      }
      uVar63 = 0;
      do {
        dVar67 = ((double)(int)uVar63 + 0.5) * (20.0 / (double)fontpixelsize) + -0.5;
        fVar65 = (float)dVar67;
        fVar66 = floorf(fVar65);
        local_138._4_4_ = (float)((ulong)dVar67 >> 0x20);
        *(int *)((long)pvVar41 + uVar63 * 4 + lVar46 * 4) = (int)fVar66;
        fVar65 = (fVar65 - (float)(int)fVar66) * 2048.0;
        uVar64 = -(uint)(0.0 <= 2048.0 - fVar65);
        auVar73._0_4_ =
             (int)((float)(uVar64 & 0x3f000000 | ~uVar64 & 0xbf000000) + (2048.0 - fVar65));
        auVar73._4_4_ =
             (int)((float)(-(uint)(0.0 <= fVar65) & 0x3f000000 |
                          ~-(uint)(0.0 <= fVar65) & 0xbf000000) + fVar65);
        auVar73._8_4_ = 0;
        auVar73._12_4_ = (int)(local_138._4_4_ + 0.0);
        auVar68 = packssdw(auVar73,auVar73);
        *(int *)(local_128 + uVar63 * 2) = auVar68._0_4_;
        uVar63 = uVar63 + 1;
      } while (uVar52 != uVar63);
    }
  }
  local_c8.cstep = 0;
  local_c8.data = (undefined1 (*) [16])0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8._20_8_ = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  Mat::create(&local_c8,fontpixelsize,2,(Allocator *)0x0);
  local_78.cstep = 0;
  local_78.data = (undefined1 (*) [16])0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,fontpixelsize,2,(Allocator *)0x0);
  pauVar53 = (undefined1 (*) [16])local_78.data;
  if (0 < fontpixelsize) {
    local_138 = (undefined1 (*) [16])local_c8.data;
    memset(local_78.data,0,(ulong)uVar36);
    lVar1 = (long)(int)uVar36 * 4 + lVar46 * 4;
    lVar38 = lVar1 + 2;
    iVar40 = 0;
    iVar39 = -2;
    do {
      iVar3 = *(int *)((long)pvVar41 + (long)iVar40 * 4 + lVar46 * 4);
      pauVar58 = local_138;
      if (iVar3 != iVar39) {
        iVar56 = iVar3 * 10;
        if (iVar3 == iVar39 + 1) {
          pauVar58 = pauVar53;
          pauVar53 = local_138;
          if (iVar3 < 0x27) {
            pbVar43 = font_bitmap + (iVar56 + 10);
            uVar52 = 0;
            do {
              uVar64 = *(uint *)((long)pvVar41 + uVar52 * 4);
              if ((int)uVar64 < 0) {
                bVar49 = *pbVar43 & 0xf;
                bVar55 = 0;
              }
              else if (uVar64 < 0x13) {
                bVar49 = pbVar43[uVar64 >> 1];
                if ((uVar64 & 1) == 0) {
                  bVar55 = bVar49 & 0xf;
                  bVar49 = bVar49 >> 4;
                }
                else {
                  bVar55 = bVar49 >> 4;
                  bVar49 = pbVar43[(ulong)(uVar64 >> 1) + 1] & 0xf;
                }
              }
              else {
                bVar55 = pbVar43[9] >> 4;
                bVar49 = 0;
              }
              uVar64 = (uint)bVar49 * (int)*(short *)((long)pvVar41 + uVar52 * 4 + lVar38) +
                       (uint)bVar55 * (int)*(short *)((long)pvVar41 + uVar52 * 4 + lVar1);
              *(short *)(*local_138 + uVar52 * 2) = (short)(uVar64 >> 4) + (short)uVar64;
              uVar52 = uVar52 + 1;
            } while (uVar42 != uVar52);
          }
          else {
            memset(local_138,0,uVar42 * 2);
          }
        }
        else {
          pbVar43 = font_bitmap + iVar56;
          lVar54 = (long)iVar56 + 1;
          if (iVar3 < 0x27) {
            pbVar51 = font_bitmap + (iVar56 + 10);
            uVar52 = 0;
            do {
              uVar64 = *(uint *)((long)pvVar41 + uVar52 * 4);
              if ((int)uVar64 < 0) {
                bVar49 = *pbVar43 & 0xf;
                bVar55 = *pbVar51 & 0xf;
                uVar64 = 0;
                bVar60 = 0;
              }
              else if (uVar64 < 0x13) {
                uVar63 = (ulong)(uVar64 >> 1);
                bVar49 = pbVar43[uVar63];
                if ((uVar64 & 1) == 0) {
                  bVar60 = bVar49 & 0xf;
                  bVar49 = bVar49 >> 4;
                  uVar64 = (uint)(pbVar51[uVar63] & 0xf);
                  bVar55 = pbVar51[uVar63] >> 4;
                }
                else {
                  bVar60 = bVar49 >> 4;
                  bVar49 = font_bitmap[uVar63 + lVar54] & 0xf;
                  uVar64 = (uint)(pbVar51[uVar63] >> 4);
                  bVar55 = pbVar51[uVar63 + 1] & 0xf;
                }
              }
              else {
                bVar60 = pbVar43[9] >> 4;
                uVar64 = (uint)(pbVar51[9] >> 4);
                bVar55 = 0;
                bVar49 = 0;
              }
              iVar39 = (int)*(short *)((long)pvVar41 + uVar52 * 4 + lVar1);
              iVar56 = (int)*(short *)((long)pvVar41 + uVar52 * 4 + lVar38);
              uVar59 = (uint)bVar49 * iVar56 + (uint)bVar60 * iVar39;
              *(short *)(*local_138 + uVar52 * 2) = (short)(uVar59 >> 4) + (short)uVar59;
              uVar64 = (uint)bVar55 * iVar56 + uVar64 * iVar39;
              *(short *)(*pauVar53 + uVar52 * 2) = (short)(uVar64 >> 4) + (short)uVar64;
              uVar52 = uVar52 + 1;
            } while (uVar42 != uVar52);
          }
          else {
            uVar52 = 0;
            do {
              uVar64 = *(uint *)((long)pvVar41 + uVar52 * 4);
              if ((int)uVar64 < 0) {
                bVar49 = *pbVar43 & 0xf;
                bVar55 = 0;
              }
              else if (uVar64 < 0x13) {
                bVar49 = pbVar43[uVar64 >> 1];
                if ((uVar64 & 1) == 0) {
                  bVar55 = bVar49 & 0xf;
                  bVar49 = bVar49 >> 4;
                }
                else {
                  bVar55 = bVar49 >> 4;
                  bVar49 = font_bitmap[(ulong)(uVar64 >> 1) + lVar54] & 0xf;
                }
              }
              else {
                bVar55 = pbVar43[9] >> 4;
                bVar49 = 0;
              }
              uVar64 = (uint)bVar49 * (int)*(short *)((long)pvVar41 + uVar52 * 4 + lVar38) +
                       (uint)bVar55 * (int)*(short *)((long)pvVar41 + uVar52 * 4 + lVar1);
              *(short *)(*local_138 + uVar52 * 2) = (short)(uVar64 >> 4) + (short)uVar64;
              *(undefined2 *)(*pauVar53 + uVar52 * 2) = 0;
              uVar52 = uVar52 + 1;
            } while (uVar42 != uVar52);
          }
        }
      }
      iVar56 = iVar40 + 1;
      if (iVar56 < (int)uVar36) {
        uVar2 = *local_128;
        if (*(int *)((long)pvVar41 + (long)iVar56 * 4 + lVar46 * 4) != iVar3) goto LAB_0013ad53;
        puVar50 = resized_font_bitmap + iVar40 * fontpixelsize;
        puVar57 = resized_font_bitmap + iVar56 * fontpixelsize;
        uVar64 = (uint)(short)local_128[1];
        uVar62 = (uint)(short)local_128[2];
        uVar59 = (uint)(short)local_128[3];
        auVar68 = pshuflw(ZEXT216(uVar2),ZEXT216(uVar2),0);
        auVar69._0_4_ = auVar68._0_4_;
        auVar69._4_4_ = auVar69._0_4_;
        auVar69._8_4_ = auVar69._0_4_;
        auVar69._12_4_ = auVar69._0_4_;
        auVar68 = pshuflw(ZEXT416(uVar64),ZEXT416(uVar64),0);
        auVar70._0_4_ = auVar68._0_4_;
        auVar70._4_4_ = auVar70._0_4_;
        auVar70._8_4_ = auVar70._0_4_;
        auVar70._12_4_ = auVar70._0_4_;
        auVar68 = pshuflw(ZEXT416(uVar62),ZEXT416(uVar62),0);
        auVar71._0_4_ = auVar68._0_4_;
        auVar71._4_4_ = auVar71._0_4_;
        auVar71._8_4_ = auVar71._0_4_;
        auVar71._12_4_ = auVar71._0_4_;
        auVar68 = pshuflw(ZEXT416(uVar59),ZEXT416(uVar59),0);
        auVar72._0_4_ = auVar68._0_4_;
        auVar72._4_4_ = auVar72._0_4_;
        auVar72._8_4_ = auVar72._0_4_;
        auVar72._12_4_ = auVar72._0_4_;
        pauVar45 = pauVar53;
        pauVar48 = pauVar58;
        if ((uint)fontpixelsize < 0x10) {
          uVar61 = 0;
        }
        else {
          iVar39 = 0xf;
          do {
            auVar81 = pmulhw(*pauVar48,auVar69);
            auVar76 = pmulhw(*pauVar45,auVar70);
            auVar82 = pmulhw(pauVar48[1],auVar69);
            auVar83 = pmulhw(pauVar45[1],auVar70);
            auVar78 = pmulhw(*pauVar48,auVar71);
            auVar68 = pmulhw(*pauVar45,auVar72);
            auVar80 = pmulhw(pauVar48[1],auVar71);
            auVar73 = pmulhw(pauVar45[1],auVar72);
            auVar77._0_2_ = auVar76._0_2_ + auVar81._0_2_ + 2;
            auVar77._2_2_ = auVar76._2_2_ + auVar81._2_2_ + 2;
            auVar77._4_2_ = auVar76._4_2_ + auVar81._4_2_ + 2;
            auVar77._6_2_ = auVar76._6_2_ + auVar81._6_2_ + 2;
            auVar77._8_2_ = auVar76._8_2_ + auVar81._8_2_ + 2;
            auVar77._10_2_ = auVar76._10_2_ + auVar81._10_2_ + 2;
            auVar77._12_2_ = auVar76._12_2_ + auVar81._12_2_ + 2;
            auVar77._14_2_ = auVar76._14_2_ + auVar81._14_2_ + 2;
            auVar76 = psraw(auVar77,2);
            auVar84._0_2_ = auVar83._0_2_ + auVar82._0_2_ + 2;
            auVar84._2_2_ = auVar83._2_2_ + auVar82._2_2_ + 2;
            auVar84._4_2_ = auVar83._4_2_ + auVar82._4_2_ + 2;
            auVar84._6_2_ = auVar83._6_2_ + auVar82._6_2_ + 2;
            auVar84._8_2_ = auVar83._8_2_ + auVar82._8_2_ + 2;
            auVar84._10_2_ = auVar83._10_2_ + auVar82._10_2_ + 2;
            auVar84._12_2_ = auVar83._12_2_ + auVar82._12_2_ + 2;
            auVar84._14_2_ = auVar83._14_2_ + auVar82._14_2_ + 2;
            auVar81 = psraw(auVar84,2);
            sVar4 = auVar76._0_2_;
            sVar6 = auVar76._2_2_;
            sVar8 = auVar76._4_2_;
            sVar10 = auVar76._6_2_;
            sVar12 = auVar76._8_2_;
            sVar14 = auVar76._10_2_;
            sVar16 = auVar76._12_2_;
            sVar18 = auVar76._14_2_;
            sVar20 = auVar81._0_2_;
            sVar22 = auVar81._2_2_;
            sVar24 = auVar81._4_2_;
            sVar26 = auVar81._6_2_;
            sVar28 = auVar81._8_2_;
            sVar30 = auVar81._10_2_;
            sVar32 = auVar81._12_2_;
            sVar34 = auVar81._14_2_;
            auVar83._0_2_ = auVar68._0_2_ + auVar78._0_2_ + 2;
            auVar83._2_2_ = auVar68._2_2_ + auVar78._2_2_ + 2;
            auVar83._4_2_ = auVar68._4_2_ + auVar78._4_2_ + 2;
            auVar83._6_2_ = auVar68._6_2_ + auVar78._6_2_ + 2;
            auVar83._8_2_ = auVar68._8_2_ + auVar78._8_2_ + 2;
            auVar83._10_2_ = auVar68._10_2_ + auVar78._10_2_ + 2;
            auVar83._12_2_ = auVar68._12_2_ + auVar78._12_2_ + 2;
            auVar83._14_2_ = auVar68._14_2_ + auVar78._14_2_ + 2;
            auVar68 = psraw(auVar83,2);
            auVar74._0_2_ = auVar73._0_2_ + auVar80._0_2_ + 2;
            auVar74._2_2_ = auVar73._2_2_ + auVar80._2_2_ + 2;
            auVar74._4_2_ = auVar73._4_2_ + auVar80._4_2_ + 2;
            auVar74._6_2_ = auVar73._6_2_ + auVar80._6_2_ + 2;
            auVar74._8_2_ = auVar73._8_2_ + auVar80._8_2_ + 2;
            auVar74._10_2_ = auVar73._10_2_ + auVar80._10_2_ + 2;
            auVar74._12_2_ = auVar73._12_2_ + auVar80._12_2_ + 2;
            auVar74._14_2_ = auVar73._14_2_ + auVar80._14_2_ + 2;
            auVar73 = psraw(auVar74,2);
            sVar5 = auVar68._0_2_;
            sVar7 = auVar68._2_2_;
            sVar9 = auVar68._4_2_;
            sVar11 = auVar68._6_2_;
            sVar13 = auVar68._8_2_;
            sVar15 = auVar68._10_2_;
            sVar17 = auVar68._12_2_;
            sVar19 = auVar68._14_2_;
            sVar21 = auVar73._0_2_;
            sVar23 = auVar73._2_2_;
            sVar25 = auVar73._4_2_;
            sVar27 = auVar73._6_2_;
            sVar29 = auVar73._8_2_;
            sVar31 = auVar73._10_2_;
            sVar33 = auVar73._12_2_;
            sVar35 = auVar73._14_2_;
            *puVar50 = (0 < sVar4) * (sVar4 < 0x100) * auVar76[0] - (0xff < sVar4);
            puVar50[1] = (0 < sVar6) * (sVar6 < 0x100) * auVar76[2] - (0xff < sVar6);
            puVar50[2] = (0 < sVar8) * (sVar8 < 0x100) * auVar76[4] - (0xff < sVar8);
            puVar50[3] = (0 < sVar10) * (sVar10 < 0x100) * auVar76[6] - (0xff < sVar10);
            puVar50[4] = (0 < sVar12) * (sVar12 < 0x100) * auVar76[8] - (0xff < sVar12);
            puVar50[5] = (0 < sVar14) * (sVar14 < 0x100) * auVar76[10] - (0xff < sVar14);
            puVar50[6] = (0 < sVar16) * (sVar16 < 0x100) * auVar76[0xc] - (0xff < sVar16);
            puVar50[7] = (0 < sVar18) * (sVar18 < 0x100) * auVar76[0xe] - (0xff < sVar18);
            puVar50[8] = (0 < sVar20) * (sVar20 < 0x100) * auVar81[0] - (0xff < sVar20);
            puVar50[9] = (0 < sVar22) * (sVar22 < 0x100) * auVar81[2] - (0xff < sVar22);
            puVar50[10] = (0 < sVar24) * (sVar24 < 0x100) * auVar81[4] - (0xff < sVar24);
            puVar50[0xb] = (0 < sVar26) * (sVar26 < 0x100) * auVar81[6] - (0xff < sVar26);
            puVar50[0xc] = (0 < sVar28) * (sVar28 < 0x100) * auVar81[8] - (0xff < sVar28);
            puVar50[0xd] = (0 < sVar30) * (sVar30 < 0x100) * auVar81[10] - (0xff < sVar30);
            puVar50[0xe] = (0 < sVar32) * (sVar32 < 0x100) * auVar81[0xc] - (0xff < sVar32);
            puVar50[0xf] = (0 < sVar34) * (sVar34 < 0x100) * auVar81[0xe] - (0xff < sVar34);
            *puVar57 = (0 < sVar5) * (sVar5 < 0x100) * auVar68[0] - (0xff < sVar5);
            puVar57[1] = (0 < sVar7) * (sVar7 < 0x100) * auVar68[2] - (0xff < sVar7);
            puVar57[2] = (0 < sVar9) * (sVar9 < 0x100) * auVar68[4] - (0xff < sVar9);
            puVar57[3] = (0 < sVar11) * (sVar11 < 0x100) * auVar68[6] - (0xff < sVar11);
            puVar57[4] = (0 < sVar13) * (sVar13 < 0x100) * auVar68[8] - (0xff < sVar13);
            puVar57[5] = (0 < sVar15) * (sVar15 < 0x100) * auVar68[10] - (0xff < sVar15);
            puVar57[6] = (0 < sVar17) * (sVar17 < 0x100) * auVar68[0xc] - (0xff < sVar17);
            puVar57[7] = (0 < sVar19) * (sVar19 < 0x100) * auVar68[0xe] - (0xff < sVar19);
            puVar57[8] = (0 < sVar21) * (sVar21 < 0x100) * auVar73[0] - (0xff < sVar21);
            puVar57[9] = (0 < sVar23) * (sVar23 < 0x100) * auVar73[2] - (0xff < sVar23);
            puVar57[10] = (0 < sVar25) * (sVar25 < 0x100) * auVar73[4] - (0xff < sVar25);
            puVar57[0xb] = (0 < sVar27) * (sVar27 < 0x100) * auVar73[6] - (0xff < sVar27);
            puVar57[0xc] = (0 < sVar29) * (sVar29 < 0x100) * auVar73[8] - (0xff < sVar29);
            puVar57[0xd] = (0 < sVar31) * (sVar31 < 0x100) * auVar73[10] - (0xff < sVar31);
            puVar57[0xe] = (0 < sVar33) * (sVar33 < 0x100) * auVar73[0xc] - (0xff < sVar33);
            puVar57[0xf] = (0 < sVar35) * (sVar35 < 0x100) * auVar73[0xe] - (0xff < sVar35);
            puVar50 = puVar50 + 0x10;
            puVar57 = puVar57 + 0x10;
            pauVar48 = pauVar48 + 2;
            pauVar45 = pauVar45 + 2;
            iVar39 = iVar39 + 0x10;
            uVar61 = fontpixelsize & 0x7ffffff0U;
          } while (iVar39 < fontpixelsize);
        }
        if ((int)(uVar61 | 7) < fontpixelsize) {
          lVar54 = 0;
          pauVar44 = pauVar45;
          pauVar47 = pauVar48;
          do {
            auVar76 = pmulhw(*(undefined1 (*) [16])(*pauVar48 + lVar54 * 2),auVar69);
            auVar78 = pmulhw(*(undefined1 (*) [16])(*pauVar45 + lVar54 * 2),auVar70);
            auVar68 = pmulhw(*(undefined1 (*) [16])(*pauVar48 + lVar54 * 2),auVar71);
            auVar73 = pmulhw(*(undefined1 (*) [16])(*pauVar45 + lVar54 * 2),auVar72);
            auVar79._0_2_ = auVar78._0_2_ + auVar76._0_2_ + 2;
            auVar79._2_2_ = auVar78._2_2_ + auVar76._2_2_ + 2;
            auVar79._4_2_ = auVar78._4_2_ + auVar76._4_2_ + 2;
            auVar79._6_2_ = auVar78._6_2_ + auVar76._6_2_ + 2;
            auVar79._8_2_ = auVar78._8_2_ + auVar76._8_2_ + 2;
            auVar79._10_2_ = auVar78._10_2_ + auVar76._10_2_ + 2;
            auVar79._12_2_ = auVar78._12_2_ + auVar76._12_2_ + 2;
            auVar79._14_2_ = auVar78._14_2_ + auVar76._14_2_ + 2;
            auVar76 = psraw(auVar79,2);
            sVar4 = auVar76._0_2_;
            sVar6 = auVar76._2_2_;
            sVar8 = auVar76._4_2_;
            sVar10 = auVar76._6_2_;
            sVar12 = auVar76._8_2_;
            sVar14 = auVar76._10_2_;
            sVar16 = auVar76._12_2_;
            sVar18 = auVar76._14_2_;
            auVar75._0_2_ = auVar73._0_2_ + auVar68._0_2_ + 2;
            auVar75._2_2_ = auVar73._2_2_ + auVar68._2_2_ + 2;
            auVar75._4_2_ = auVar73._4_2_ + auVar68._4_2_ + 2;
            auVar75._6_2_ = auVar73._6_2_ + auVar68._6_2_ + 2;
            auVar75._8_2_ = auVar73._8_2_ + auVar68._8_2_ + 2;
            auVar75._10_2_ = auVar73._10_2_ + auVar68._10_2_ + 2;
            auVar75._12_2_ = auVar73._12_2_ + auVar68._12_2_ + 2;
            auVar75._14_2_ = auVar73._14_2_ + auVar68._14_2_ + 2;
            auVar68 = psraw(auVar75,2);
            sVar5 = auVar68._0_2_;
            sVar7 = auVar68._2_2_;
            sVar9 = auVar68._4_2_;
            sVar11 = auVar68._6_2_;
            sVar13 = auVar68._8_2_;
            sVar15 = auVar68._10_2_;
            sVar17 = auVar68._12_2_;
            sVar19 = auVar68._14_2_;
            *(ulong *)(puVar50 + lVar54) =
                 CONCAT17((0 < sVar18) * (sVar18 < 0x100) * auVar76[0xe] - (0xff < sVar18),
                          CONCAT16((0 < sVar16) * (sVar16 < 0x100) * auVar76[0xc] - (0xff < sVar16),
                                   CONCAT15((0 < sVar14) * (sVar14 < 0x100) * auVar76[10] -
                                            (0xff < sVar14),
                                            CONCAT14((0 < sVar12) * (sVar12 < 0x100) * auVar76[8] -
                                                     (0xff < sVar12),
                                                     CONCAT13((0 < sVar10) * (sVar10 < 0x100) *
                                                              auVar76[6] - (0xff < sVar10),
                                                              CONCAT12((0 < sVar8) * (sVar8 < 0x100)
                                                                       * auVar76[4] - (0xff < sVar8)
                                                                       ,CONCAT11((0 < sVar6) *
                                                                                 (sVar6 < 0x100) *
                                                                                 auVar76[2] -
                                                                                 (0xff < sVar6),
                                                                                 (0 < sVar4) *
                                                                                 (sVar4 < 0x100) *
                                                                                 auVar76[0] -
                                                                                 (0xff < sVar4))))))
                                  ));
            *(ulong *)(puVar57 + lVar54) =
                 CONCAT17((0 < sVar19) * (sVar19 < 0x100) * auVar68[0xe] - (0xff < sVar19),
                          CONCAT16((0 < sVar17) * (sVar17 < 0x100) * auVar68[0xc] - (0xff < sVar17),
                                   CONCAT15((0 < sVar15) * (sVar15 < 0x100) * auVar68[10] -
                                            (0xff < sVar15),
                                            CONCAT14((0 < sVar13) * (sVar13 < 0x100) * auVar68[8] -
                                                     (0xff < sVar13),
                                                     CONCAT13((0 < sVar11) * (sVar11 < 0x100) *
                                                              auVar68[6] - (0xff < sVar11),
                                                              CONCAT12((0 < sVar9) * (sVar9 < 0x100)
                                                                       * auVar68[4] - (0xff < sVar9)
                                                                       ,CONCAT11((0 < sVar7) *
                                                                                 (sVar7 < 0x100) *
                                                                                 auVar68[2] -
                                                                                 (0xff < sVar7),
                                                                                 (0 < sVar5) *
                                                                                 (sVar5 < 0x100) *
                                                                                 auVar68[0] -
                                                                                 (0xff < sVar5))))))
                                  ));
            pauVar47 = pauVar47 + 1;
            pauVar44 = pauVar44 + 1;
            lVar54 = lVar54 + 8;
          } while ((int)(uVar61 + (int)lVar54 + 7) < fontpixelsize);
          puVar50 = puVar50 + lVar54;
          puVar57 = puVar57 + lVar54;
          uVar61 = uVar61 + (int)lVar54;
          pauVar45 = pauVar44;
          pauVar48 = pauVar47;
        }
        if ((int)uVar61 < fontpixelsize) {
          lVar54 = 0;
          do {
            sVar4 = *(short *)(*pauVar48 + lVar54 * 2);
            sVar5 = *(short *)(*pauVar45 + lVar54 * 2);
            puVar50[lVar54] =
                 (uchar)(((int)sVar5 * uVar64 >> 0x10) +
                         ((uint)((int)sVar4 * (int)(short)uVar2) >> 0x10) + 2 >> 2);
            puVar57[lVar54] =
                 (uchar)(((int)sVar5 * uVar59 >> 0x10) + ((int)sVar4 * uVar62 >> 0x10) + 2 >> 2);
            lVar54 = lVar54 + 1;
          } while (fontpixelsize - uVar61 != (int)lVar54);
        }
        local_128 = local_128 + 4;
        iVar56 = iVar40 + 2;
      }
      else {
        uVar2 = *local_128;
LAB_0013ad53:
        puVar50 = resized_font_bitmap + iVar40 * fontpixelsize;
        uVar59 = (uint)(short)local_128[1];
        auVar68 = pshuflw(ZEXT216(uVar2),ZEXT216(uVar2),0);
        auVar76._0_4_ = auVar68._0_4_;
        auVar76._4_4_ = auVar76._0_4_;
        auVar76._8_4_ = auVar76._0_4_;
        auVar76._12_4_ = auVar76._0_4_;
        auVar68 = pshuflw(ZEXT416(uVar59),ZEXT416(uVar59),0);
        auVar78._0_4_ = auVar68._0_4_;
        auVar78._4_4_ = auVar78._0_4_;
        auVar78._8_4_ = auVar78._0_4_;
        auVar78._12_4_ = auVar78._0_4_;
        pauVar45 = pauVar58;
        pauVar48 = pauVar53;
        uVar64 = 0;
        if (0xf < (uint)fontpixelsize) {
          iVar40 = 0xf;
          do {
            auVar68 = pmulhw(*pauVar45,auVar76);
            auVar80 = pmulhw(*pauVar48,auVar78);
            auVar73 = pmulhw(pauVar45[1],auVar76);
            auVar82 = pmulhw(pauVar48[1],auVar78);
            auVar81._0_2_ = auVar80._0_2_ + auVar68._0_2_ + 2;
            auVar81._2_2_ = auVar80._2_2_ + auVar68._2_2_ + 2;
            auVar81._4_2_ = auVar80._4_2_ + auVar68._4_2_ + 2;
            auVar81._6_2_ = auVar80._6_2_ + auVar68._6_2_ + 2;
            auVar81._8_2_ = auVar80._8_2_ + auVar68._8_2_ + 2;
            auVar81._10_2_ = auVar80._10_2_ + auVar68._10_2_ + 2;
            auVar81._12_2_ = auVar80._12_2_ + auVar68._12_2_ + 2;
            auVar81._14_2_ = auVar80._14_2_ + auVar68._14_2_ + 2;
            auVar68 = psraw(auVar81,2);
            auVar80._0_2_ = auVar82._0_2_ + auVar73._0_2_ + 2;
            auVar80._2_2_ = auVar82._2_2_ + auVar73._2_2_ + 2;
            auVar80._4_2_ = auVar82._4_2_ + auVar73._4_2_ + 2;
            auVar80._6_2_ = auVar82._6_2_ + auVar73._6_2_ + 2;
            auVar80._8_2_ = auVar82._8_2_ + auVar73._8_2_ + 2;
            auVar80._10_2_ = auVar82._10_2_ + auVar73._10_2_ + 2;
            auVar80._12_2_ = auVar82._12_2_ + auVar73._12_2_ + 2;
            auVar80._14_2_ = auVar82._14_2_ + auVar73._14_2_ + 2;
            auVar73 = psraw(auVar80,2);
            sVar4 = auVar68._0_2_;
            sVar5 = auVar68._2_2_;
            sVar6 = auVar68._4_2_;
            sVar7 = auVar68._6_2_;
            sVar8 = auVar68._8_2_;
            sVar9 = auVar68._10_2_;
            sVar10 = auVar68._12_2_;
            sVar11 = auVar68._14_2_;
            sVar12 = auVar73._0_2_;
            sVar13 = auVar73._2_2_;
            sVar14 = auVar73._4_2_;
            sVar15 = auVar73._6_2_;
            sVar16 = auVar73._8_2_;
            sVar17 = auVar73._10_2_;
            sVar18 = auVar73._12_2_;
            sVar19 = auVar73._14_2_;
            *puVar50 = (0 < sVar4) * (sVar4 < 0x100) * auVar68[0] - (0xff < sVar4);
            puVar50[1] = (0 < sVar5) * (sVar5 < 0x100) * auVar68[2] - (0xff < sVar5);
            puVar50[2] = (0 < sVar6) * (sVar6 < 0x100) * auVar68[4] - (0xff < sVar6);
            puVar50[3] = (0 < sVar7) * (sVar7 < 0x100) * auVar68[6] - (0xff < sVar7);
            puVar50[4] = (0 < sVar8) * (sVar8 < 0x100) * auVar68[8] - (0xff < sVar8);
            puVar50[5] = (0 < sVar9) * (sVar9 < 0x100) * auVar68[10] - (0xff < sVar9);
            puVar50[6] = (0 < sVar10) * (sVar10 < 0x100) * auVar68[0xc] - (0xff < sVar10);
            puVar50[7] = (0 < sVar11) * (sVar11 < 0x100) * auVar68[0xe] - (0xff < sVar11);
            puVar50[8] = (0 < sVar12) * (sVar12 < 0x100) * auVar73[0] - (0xff < sVar12);
            puVar50[9] = (0 < sVar13) * (sVar13 < 0x100) * auVar73[2] - (0xff < sVar13);
            puVar50[10] = (0 < sVar14) * (sVar14 < 0x100) * auVar73[4] - (0xff < sVar14);
            puVar50[0xb] = (0 < sVar15) * (sVar15 < 0x100) * auVar73[6] - (0xff < sVar15);
            puVar50[0xc] = (0 < sVar16) * (sVar16 < 0x100) * auVar73[8] - (0xff < sVar16);
            puVar50[0xd] = (0 < sVar17) * (sVar17 < 0x100) * auVar73[10] - (0xff < sVar17);
            puVar50[0xe] = (0 < sVar18) * (sVar18 < 0x100) * auVar73[0xc] - (0xff < sVar18);
            puVar50[0xf] = (0 < sVar19) * (sVar19 < 0x100) * auVar73[0xe] - (0xff < sVar19);
            puVar50 = puVar50 + 0x10;
            pauVar45 = pauVar45 + 2;
            pauVar48 = pauVar48 + 2;
            iVar40 = iVar40 + 0x10;
            uVar64 = fontpixelsize & 0x7ffffff0U;
          } while (iVar40 < fontpixelsize);
        }
        uVar62 = uVar64 | 7;
        while ((int)uVar62 < fontpixelsize) {
          auVar68 = pmulhw(*pauVar45,auVar76);
          auVar73 = pmulhw(*pauVar48,auVar78);
          auVar82._0_2_ = auVar73._0_2_ + auVar68._0_2_ + 2;
          auVar82._2_2_ = auVar73._2_2_ + auVar68._2_2_ + 2;
          auVar82._4_2_ = auVar73._4_2_ + auVar68._4_2_ + 2;
          auVar82._6_2_ = auVar73._6_2_ + auVar68._6_2_ + 2;
          auVar82._8_2_ = auVar73._8_2_ + auVar68._8_2_ + 2;
          auVar82._10_2_ = auVar73._10_2_ + auVar68._10_2_ + 2;
          auVar82._12_2_ = auVar73._12_2_ + auVar68._12_2_ + 2;
          auVar82._14_2_ = auVar73._14_2_ + auVar68._14_2_ + 2;
          auVar68 = psraw(auVar82,2);
          sVar4 = auVar68._0_2_;
          sVar5 = auVar68._2_2_;
          sVar6 = auVar68._4_2_;
          sVar7 = auVar68._6_2_;
          sVar8 = auVar68._8_2_;
          sVar9 = auVar68._10_2_;
          sVar10 = auVar68._12_2_;
          sVar11 = auVar68._14_2_;
          *(ulong *)puVar50 =
               CONCAT17((0 < sVar11) * (sVar11 < 0x100) * auVar68[0xe] - (0xff < sVar11),
                        CONCAT16((0 < sVar10) * (sVar10 < 0x100) * auVar68[0xc] - (0xff < sVar10),
                                 CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar68[10] -
                                          (0xff < sVar9),
                                          CONCAT14((0 < sVar8) * (sVar8 < 0x100) * auVar68[8] -
                                                   (0xff < sVar8),
                                                   CONCAT13((0 < sVar7) * (sVar7 < 0x100) *
                                                            auVar68[6] - (0xff < sVar7),
                                                            CONCAT12((0 < sVar6) * (sVar6 < 0x100) *
                                                                     auVar68[4] - (0xff < sVar6),
                                                                     CONCAT11((0 < sVar5) *
                                                                              (sVar5 < 0x100) *
                                                                              auVar68[2] -
                                                                              (0xff < sVar5),
                                                                              (0 < sVar4) *
                                                                              (sVar4 < 0x100) *
                                                                              auVar68[0] -
                                                                              (0xff < sVar4))))))));
          puVar50 = puVar50 + 8;
          pauVar45 = pauVar45 + 1;
          pauVar48 = pauVar48 + 1;
          uVar62 = uVar64 + 0xf;
          uVar64 = uVar64 + 8;
        }
        if ((int)uVar64 < fontpixelsize) {
          lVar54 = 0;
          do {
            puVar50[lVar54] =
                 (uchar)(((uint)((int)*(short *)(*pauVar45 + lVar54 * 2) * (int)(short)uVar2) >>
                         0x10) + ((int)*(short *)(*pauVar48 + lVar54 * 2) * uVar59 >> 0x10) + 2 >> 2
                        );
            lVar54 = lVar54 + 1;
          } while (fontpixelsize - uVar64 != (int)lVar54);
        }
        local_128 = local_128 + 2;
      }
      local_138 = pauVar58;
      iVar40 = iVar56;
      iVar39 = iVar3;
    } while (iVar56 < (int)uVar36);
  }
  operator_delete__(pvVar41);
  piVar37 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar37 != (int *)0x0) {
    LOCK();
    *piVar37 = *piVar37 + -1;
    UNLOCK();
    if (*piVar37 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if ((undefined1 (*) [16])local_78.data != (undefined1 (*) [16])0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar37 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar37 != (int *)0x0) {
    LOCK();
    *piVar37 = *piVar37 + -1;
    UNLOCK();
    if (*piVar37 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if ((undefined1 (*) [16])local_c8.data != (undefined1 (*) [16])0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void resize_bilinear_font(const unsigned char* font_bitmap, unsigned char* resized_font_bitmap, int fontpixelsize)
{
    const int INTER_RESIZE_COEF_BITS = 11;
    const int INTER_RESIZE_COEF_SCALE = 1 << INTER_RESIZE_COEF_BITS;

    const int srcw = 20;
    const int srch = 40;
    const int w = fontpixelsize;
    const int h = fontpixelsize * 2;

    double scale = (double)srcw / w;

    int* buf = new int[w + h + w + h];

    int* xofs = buf;     //new int[w];
    int* yofs = buf + w; //new int[h];

    short* ialpha = (short*)(buf + w + h);    //new short[w * 2];
    short* ibeta = (short*)(buf + w + h + w); //new short[h * 2];

    float fx;
    float fy;
    int sx;
    int sy;

#define SATURATE_CAST_SHORT(X) (short)::std::min(::std::max((int)(X + (X >= 0.f ? 0.5f : -0.5f)), SHRT_MIN), SHRT_MAX);

    for (int dx = 0; dx < w; dx++)
    {
        fx = (float)((dx + 0.5) * scale - 0.5);
        sx = static_cast<int>(floor(fx));
        fx -= sx;

        xofs[dx] = sx;

        float a0 = (1.f - fx) * INTER_RESIZE_COEF_SCALE;
        float a1 = fx * INTER_RESIZE_COEF_SCALE;

        ialpha[dx * 2] = SATURATE_CAST_SHORT(a0);
        ialpha[dx * 2 + 1] = SATURATE_CAST_SHORT(a1);
    }

    for (int dy = 0; dy < h; dy++)
    {
        fy = (float)((dy + 0.5) * scale - 0.5);
        sy = static_cast<int>(floor(fy));
        fy -= sy;

        yofs[dy] = sy;

        float b0 = (1.f - fy) * INTER_RESIZE_COEF_SCALE;
        float b1 = fy * INTER_RESIZE_COEF_SCALE;

        ibeta[dy * 2] = SATURATE_CAST_SHORT(b0);
        ibeta[dy * 2 + 1] = SATURATE_CAST_SHORT(b1);
    }

#undef SATURATE_CAST_SHORT

    // loop body
    Mat rowsbuf0(w, (size_t)2u);
    Mat rowsbuf1(w, (size_t)2u);
    short* rows0 = (short*)rowsbuf0;
    short* rows1 = (short*)rowsbuf1;

    {
        short* rows1p = rows1;
        for (int dx = 0; dx < w; dx++)
        {
            rows1p[dx] = 0;
        }
    }

    int prev_sy1 = -2;

    for (int dy = 0; dy < h; dy++)
    {
        sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            short* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const unsigned char* S1 = font_bitmap + 10 * (sy + 1);

            if (sy >= srch - 1)
            {
                short* rows1p = rows1;
                for (int dx = 0; dx < w; dx++)
                {
                    rows1p[dx] = 0;
                }
            }
            else
            {
                const short* ialphap = ialpha;
                short* rows1p = rows1;
                for (int dx = 0; dx < w; dx++)
                {
                    sx = xofs[dx];
                    short a0 = ialphap[0];
                    short a1 = ialphap[1];

                    unsigned char S1p0;
                    unsigned char S1p1;

                    if (sx < 0)
                    {
                        S1p0 = 0;
                        S1p1 = S1[0] & 0x0f;
                    }
                    else if (sx >= srcw - 1)
                    {
                        S1p0 = (S1[9] & 0xf0) >> 4;
                        S1p1 = 0;
                    }
                    else
                    {
                        S1p0 = sx % 2 == 0 ? S1[sx / 2] & 0x0f : (S1[sx / 2] & 0xf0) >> 4;
                        S1p1 = sx % 2 == 0 ? (S1[sx / 2] & 0xf0) >> 4 : S1[sx / 2 + 1] & 0x0f;
                    }
                    rows1p[dx] = (S1p0 * a0 + S1p1 * a1) * 17 >> 4;

                    ialphap += 2;
                }
            }
        }
        else
        {
            // hresize two rows
            const unsigned char* S0 = font_bitmap + 10 * (sy);
            const unsigned char* S1 = font_bitmap + 10 * (sy + 1);

            if (sy >= srch - 1)
            {
                const short* ialphap = ialpha;
                short* rows0p = rows0;
                short* rows1p = rows1;
                for (int dx = 0; dx < w; dx++)
                {
                    sx = xofs[dx];
                    short a0 = ialphap[0];
                    short a1 = ialphap[1];

                    unsigned char S0p0;
                    unsigned char S0p1;

                    if (sx < 0)
                    {
                        S0p0 = 0;
                        S0p1 = S0[0] & 0x0f;
                    }
                    else if (sx >= srcw - 1)
                    {
                        S0p0 = (S0[9] & 0xf0) >> 4;
                        S0p1 = 0;
                    }
                    else
                    {
                        S0p0 = sx % 2 == 0 ? S0[sx / 2] & 0x0f : (S0[sx / 2] & 0xf0) >> 4;
                        S0p1 = sx % 2 == 0 ? (S0[sx / 2] & 0xf0) >> 4 : S0[sx / 2 + 1] & 0x0f;
                    }
                    rows0p[dx] = (S0p0 * a0 + S0p1 * a1) * 17 >> 4;
                    rows1p[dx] = 0;

                    ialphap += 2;
                }
            }
            else
            {
                const short* ialphap = ialpha;
                short* rows0p = rows0;
                short* rows1p = rows1;
                for (int dx = 0; dx < w; dx++)
                {
                    sx = xofs[dx];
                    short a0 = ialphap[0];
                    short a1 = ialphap[1];

                    unsigned char S0p0;
                    unsigned char S0p1;
                    unsigned char S1p0;
                    unsigned char S1p1;

                    if (sx < 0)
                    {
                        S0p0 = 0;
                        S0p1 = S0[0] & 0x0f;
                        S1p0 = 0;
                        S1p1 = S1[0] & 0x0f;
                    }
                    else if (sx >= srcw - 1)
                    {
                        S0p0 = (S0[9] & 0xf0) >> 4;
                        S0p1 = 0;
                        S1p0 = (S1[9] & 0xf0) >> 4;
                        S1p1 = 0;
                    }
                    else
                    {
                        S0p0 = sx % 2 == 0 ? S0[sx / 2] & 0x0f : (S0[sx / 2] & 0xf0) >> 4;
                        S0p1 = sx % 2 == 0 ? (S0[sx / 2] & 0xf0) >> 4 : S0[sx / 2 + 1] & 0x0f;
                        S1p0 = sx % 2 == 0 ? S1[sx / 2] & 0x0f : (S1[sx / 2] & 0xf0) >> 4;
                        S1p1 = sx % 2 == 0 ? (S1[sx / 2] & 0xf0) >> 4 : S1[sx / 2 + 1] & 0x0f;
                    }
                    rows0p[dx] = (S0p0 * a0 + S0p1 * a1) * 17 >> 4;
                    rows1p[dx] = (S1p0 * a0 + S1p1 * a1) * 17 >> 4;

                    ialphap += 2;
                }
            }
        }

        prev_sy1 = sy;

        if (dy + 1 < h && yofs[dy + 1] == sy)
        {
            // vresize for two rows
            short b0 = ibeta[0];
            short b1 = ibeta[1];
            short b2 = ibeta[2];
            short b3 = ibeta[3];

            short* rows0p = rows0;
            short* rows1p = rows1;
            unsigned char* Dp0 = resized_font_bitmap + w * (dy);
            unsigned char* Dp1 = resized_font_bitmap + w * (dy + 1);

            int dx = 0;
#if __ARM_NEON
            int16x8_t _b0 = vdupq_n_s16(b0);
            int16x8_t _b1 = vdupq_n_s16(b1);
            int16x8_t _b2 = vdupq_n_s16(b2);
            int16x8_t _b3 = vdupq_n_s16(b3);
            for (; dx + 15 < w; dx += 16)
            {
                int16x8_t _r00 = vld1q_s16(rows0p);
                int16x8_t _r01 = vld1q_s16(rows0p + 8);
                int16x8_t _r10 = vld1q_s16(rows1p);
                int16x8_t _r11 = vld1q_s16(rows1p + 8);
                int16x8_t _acc00 = vaddq_s16(vqdmulhq_s16(_r00, _b0), vqdmulhq_s16(_r10, _b1));
                int16x8_t _acc01 = vaddq_s16(vqdmulhq_s16(_r01, _b0), vqdmulhq_s16(_r11, _b1));
                int16x8_t _acc10 = vaddq_s16(vqdmulhq_s16(_r00, _b2), vqdmulhq_s16(_r10, _b3));
                int16x8_t _acc11 = vaddq_s16(vqdmulhq_s16(_r01, _b2), vqdmulhq_s16(_r11, _b3));
                uint8x16_t _Dp0 = vcombine_u8(vqrshrun_n_s16(_acc00, 3), vqrshrun_n_s16(_acc01, 3));
                uint8x16_t _Dp1 = vcombine_u8(vqrshrun_n_s16(_acc10, 3), vqrshrun_n_s16(_acc11, 3));
                vst1q_u8(Dp0, _Dp0);
                vst1q_u8(Dp1, _Dp1);
                Dp0 += 16;
                Dp1 += 16;
                rows0p += 16;
                rows1p += 16;
            }
            for (; dx + 7 < w; dx += 8)
            {
                int16x8_t _r0 = vld1q_s16(rows0p);
                int16x8_t _r1 = vld1q_s16(rows1p);
                int16x8_t _acc0 = vaddq_s16(vqdmulhq_s16(_r0, _b0), vqdmulhq_s16(_r1, _b1));
                int16x8_t _acc1 = vaddq_s16(vqdmulhq_s16(_r0, _b2), vqdmulhq_s16(_r1, _b3));
                uint8x8_t _Dp0 = vqrshrun_n_s16(_acc0, 3);
                uint8x8_t _Dp1 = vqrshrun_n_s16(_acc1, 3);
                vst1_u8(Dp0, _Dp0);
                vst1_u8(Dp1, _Dp1);
                Dp0 += 8;
                Dp1 += 8;
                rows0p += 8;
                rows1p += 8;
            }
#endif // __ARM_NEON
#if __SSE2__
            __m128i _b0 = _mm_set1_epi16(b0);
            __m128i _b1 = _mm_set1_epi16(b1);
            __m128i _b2 = _mm_set1_epi16(b2);
            __m128i _b3 = _mm_set1_epi16(b3);
            __m128i _v2 = _mm_set1_epi16(2);
            for (; dx + 15 < w; dx += 16)
            {
                __m128i _r00 = _mm_loadu_si128((const __m128i*)rows0p);
                __m128i _r01 = _mm_loadu_si128((const __m128i*)(rows0p + 8));
                __m128i _r10 = _mm_loadu_si128((const __m128i*)rows1p);
                __m128i _r11 = _mm_loadu_si128((const __m128i*)(rows1p + 8));
                __m128i _acc00 = _mm_add_epi16(_mm_mulhi_epi16(_r00, _b0), _mm_mulhi_epi16(_r10, _b1));
                __m128i _acc01 = _mm_add_epi16(_mm_mulhi_epi16(_r01, _b0), _mm_mulhi_epi16(_r11, _b1));
                __m128i _acc10 = _mm_add_epi16(_mm_mulhi_epi16(_r00, _b2), _mm_mulhi_epi16(_r10, _b3));
                __m128i _acc11 = _mm_add_epi16(_mm_mulhi_epi16(_r01, _b2), _mm_mulhi_epi16(_r11, _b3));
                _acc00 = _mm_srai_epi16(_mm_add_epi16(_acc00, _v2), 2);
                _acc01 = _mm_srai_epi16(_mm_add_epi16(_acc01, _v2), 2);
                _acc10 = _mm_srai_epi16(_mm_add_epi16(_acc10, _v2), 2);
                _acc11 = _mm_srai_epi16(_mm_add_epi16(_acc11, _v2), 2);
                __m128i _Dp0 = _mm_packus_epi16(_acc00, _acc01);
                __m128i _Dp1 = _mm_packus_epi16(_acc10, _acc11);
                _mm_storeu_si128((__m128i*)Dp0, _Dp0);
                _mm_storeu_si128((__m128i*)Dp1, _Dp1);
                Dp0 += 16;
                Dp1 += 16;
                rows0p += 16;
                rows1p += 16;
            }
            for (; dx + 7 < w; dx += 8)
            {
                __m128i _r0 = _mm_loadu_si128((const __m128i*)rows0p);
                __m128i _r1 = _mm_loadu_si128((const __m128i*)rows1p);
                __m128i _acc0 = _mm_add_epi16(_mm_mulhi_epi16(_r0, _b0), _mm_mulhi_epi16(_r1, _b1));
                __m128i _acc1 = _mm_add_epi16(_mm_mulhi_epi16(_r0, _b2), _mm_mulhi_epi16(_r1, _b3));
                _acc0 = _mm_srai_epi16(_mm_add_epi16(_acc0, _v2), 2);
                _acc1 = _mm_srai_epi16(_mm_add_epi16(_acc1, _v2), 2);
                __m128i _Dp0 = _mm_packus_epi16(_acc0, _acc0);
                __m128i _Dp1 = _mm_packus_epi16(_acc1, _acc1);
                _mm_storel_epi64((__m128i*)Dp0, _Dp0);
                _mm_storel_epi64((__m128i*)Dp1, _Dp1);
                Dp0 += 8;
                Dp1 += 8;
                rows0p += 8;
                rows1p += 8;
            }
#endif // __SSE2__
            for (; dx < w; dx++)
            {
                short s0 = *rows0p++;
                short s1 = *rows1p++;

                *Dp0++ = (unsigned char)(((short)((b0 * s0) >> 16) + (short)((b1 * s1) >> 16) + 2) >> 2);
                *Dp1++ = (unsigned char)(((short)((b2 * s0) >> 16) + (short)((b3 * s1) >> 16) + 2) >> 2);
            }

            ibeta += 4;
            dy += 1;
        }
        else
        {
            // vresize
            short b0 = ibeta[0];
            short b1 = ibeta[1];

            short* rows0p = rows0;
            short* rows1p = rows1;
            unsigned char* Dp = resized_font_bitmap + w * (dy);

            int dx = 0;
#if __ARM_NEON
            int16x8_t _b0 = vdupq_n_s16(b0);
            int16x8_t _b1 = vdupq_n_s16(b1);
            for (; dx + 15 < w; dx += 16)
            {
                int16x8_t _r00 = vld1q_s16(rows0p);
                int16x8_t _r01 = vld1q_s16(rows0p + 8);
                int16x8_t _r10 = vld1q_s16(rows1p);
                int16x8_t _r11 = vld1q_s16(rows1p + 8);
                int16x8_t _acc0 = vaddq_s16(vqdmulhq_s16(_r00, _b0), vqdmulhq_s16(_r10, _b1));
                int16x8_t _acc1 = vaddq_s16(vqdmulhq_s16(_r01, _b0), vqdmulhq_s16(_r11, _b1));
                uint8x16_t _Dp = vcombine_u8(vqrshrun_n_s16(_acc0, 3), vqrshrun_n_s16(_acc1, 3));
                vst1q_u8(Dp, _Dp);
                Dp += 16;
                rows0p += 16;
                rows1p += 16;
            }
            for (; dx + 7 < w; dx += 8)
            {
                int16x8_t _r0 = vld1q_s16(rows0p);
                int16x8_t _r1 = vld1q_s16(rows1p);
                int16x8_t _acc = vaddq_s16(vqdmulhq_s16(_r0, _b0), vqdmulhq_s16(_r1, _b1));
                uint8x8_t _Dp = vqrshrun_n_s16(_acc, 3);
                vst1_u8(Dp, _Dp);
                Dp += 8;
                rows0p += 8;
                rows1p += 8;
            }
#endif // __ARM_NEON
#if __SSE2__
            __m128i _b0 = _mm_set1_epi16(b0);
            __m128i _b1 = _mm_set1_epi16(b1);
            __m128i _v2 = _mm_set1_epi16(2);
            for (; dx + 15 < w; dx += 16)
            {
                __m128i _r00 = _mm_loadu_si128((const __m128i*)rows0p);
                __m128i _r01 = _mm_loadu_si128((const __m128i*)(rows0p + 8));
                __m128i _r10 = _mm_loadu_si128((const __m128i*)rows1p);
                __m128i _r11 = _mm_loadu_si128((const __m128i*)(rows1p + 8));
                __m128i _acc0 = _mm_add_epi16(_mm_mulhi_epi16(_r00, _b0), _mm_mulhi_epi16(_r10, _b1));
                __m128i _acc1 = _mm_add_epi16(_mm_mulhi_epi16(_r01, _b0), _mm_mulhi_epi16(_r11, _b1));
                _acc0 = _mm_srai_epi16(_mm_add_epi16(_acc0, _v2), 2);
                _acc1 = _mm_srai_epi16(_mm_add_epi16(_acc1, _v2), 2);
                __m128i _Dp = _mm_packus_epi16(_acc0, _acc1);
                _mm_storeu_si128((__m128i*)Dp, _Dp);
                Dp += 16;
                rows0p += 16;
                rows1p += 16;
            }
            for (; dx + 7 < w; dx += 8)
            {
                __m128i _r0 = _mm_loadu_si128((const __m128i*)rows0p);
                __m128i _r1 = _mm_loadu_si128((const __m128i*)rows1p);
                __m128i _acc = _mm_add_epi16(_mm_mulhi_epi16(_r0, _b0), _mm_mulhi_epi16(_r1, _b1));
                _acc = _mm_srai_epi16(_mm_add_epi16(_acc, _v2), 2);
                __m128i _Dp = _mm_packus_epi16(_acc, _acc);
                _mm_storel_epi64((__m128i*)Dp, _Dp);
                Dp += 8;
                rows0p += 8;
                rows1p += 8;
            }
#endif // __SSE2__
            for (; dx < w; dx++)
            {
                short s0 = *rows0p++;
                short s1 = *rows1p++;

                *Dp++ = (unsigned char)(((short)((b0 * s0) >> 16) + (short)((b1 * s1) >> 16) + 2) >> 2);
            }

            ibeta += 2;
        }
    }

    delete[] buf;
}